

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunctionWithInlineCache::CreateInlineCache(ScriptFunctionWithInlineCache *this)

{
  uint uVar1;
  FunctionBody *this_00;
  FunctionBody *functionBody;
  ScriptFunctionWithInlineCache *this_local;
  
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  uVar1 = FunctionBody::GetRootObjectLoadInlineCacheStart(this_00);
  this->rootObjectLoadInlineCacheStart = uVar1;
  uVar1 = FunctionBody::GetRootObjectStoreInlineCacheStart(this_00);
  this->rootObjectStoreInlineCacheStart = uVar1;
  uVar1 = FunctionBody::GetInlineCacheCount(this_00);
  this->inlineCacheCount = uVar1;
  uVar1 = FunctionBody::GetIsInstInlineCacheCount(this_00);
  this->isInstInlineCacheCount = uVar1;
  ScriptFunction::SetHasInlineCaches(&this->super_ScriptFunction,true);
  AllocateInlineCache(this);
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::CreateInlineCache()
    {
        Js::FunctionBody *functionBody = this->GetFunctionBody();
        this->rootObjectLoadInlineCacheStart = functionBody->GetRootObjectLoadInlineCacheStart();
        this->rootObjectStoreInlineCacheStart = functionBody->GetRootObjectStoreInlineCacheStart();
        this->inlineCacheCount = functionBody->GetInlineCacheCount();
        this->isInstInlineCacheCount = functionBody->GetIsInstInlineCacheCount();

        SetHasInlineCaches(true);
        AllocateInlineCache();
    }